

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O0

TraceGeodesicResult *
geometrycentral::surface::traceGeodesic
          (IntrinsicGeometryInterface *geom,Face startFace,Vector3 startBary,Vector3 traceBaryVec,
          TraceOptions *traceOptions)

{
  Vector3 *this;
  Vector3 baryCoords;
  Face face;
  Vector3 baryVec;
  TraceSubResult prevTraceEnd_00;
  undefined1 auVar1 [64];
  Face face_00;
  runtime_error *this_00;
  size_t in_RCX;
  ParentMeshT *in_RDX;
  double in_RSI;
  TraceGeodesicResult *in_RDI;
  byte *in_R8;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  double dVar6;
  Vector2 VVar7;
  Vector2 VVar8;
  value_type *__x;
  Vector3 in_stack_00000000;
  SurfacePoint *this_01;
  undefined1 in_stack_00000018 [24];
  undefined8 in_stack_00000030;
  TraceSubResult prevTraceEnd;
  Vector2 traceVectorCartesian;
  array<geometrycentral::Vector2,_3UL> vertexCoords;
  TraceGeodesicResult *result;
  undefined1 in_stack_fffffffffffffb88 [64];
  array<geometrycentral::Vector2,_3UL> *in_stack_fffffffffffffbd0;
  IntrinsicGeometryInterface *in_stack_fffffffffffffbe0;
  ParentMeshT *in_stack_fffffffffffffbe8;
  double in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf8 [16];
  undefined1 local_2f8 [32];
  undefined8 uStack_2d8;
  undefined2 uVar9;
  undefined1 uVar10;
  undefined2 in_stack_fffffffffffffd53;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  double dVar14;
  double dVar15;
  undefined8 in_stack_fffffffffffffd80;
  double dVar16;
  double dVar17;
  undefined8 in_stack_fffffffffffffda0;
  undefined1 auVar18 [24];
  undefined1 in_stack_fffffffffffffdb8 [56];
  undefined8 uStack_210;
  undefined1 local_208 [32];
  undefined1 auStack_1e8 [32];
  undefined1 auStack_1c8 [32];
  Vector3 local_130;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 local_e8;
  value_type *local_b8;
  SurfacePoint *pSStack_b0;
  double local_a8;
  TraceOptions *in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  IntrinsicGeometryInterface *in_stack_ffffffffffffffc8;
  uint3 in_stack_ffffffffffffffd5;
  array<bool,_3UL> edgeIsHittable;
  ParentMeshT *pPVar19;
  size_t sVar20;
  
  this = (Vector3 *)(&stack0x00000018 + 8);
  IntrinsicGeometryInterface::requireVertexAngleSums((IntrinsicGeometryInterface *)0x2fa5ef);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInVertex((IntrinsicGeometryInterface *)0x2fa5fc)
  ;
  IntrinsicGeometryInterface::requireHalfedgeVectorsInFace((IntrinsicGeometryInterface *)0x2fa609);
  edgeIsHittable._M_elems = (_Type)(in_stack_ffffffffffffffd5 & 0xffff);
  TraceGeodesicResult::TraceGeodesicResult(in_stack_fffffffffffffb88._8_8_);
  in_RDI->hasPath = (bool)(*in_R8 & 1);
  if ((*in_R8 & 1) != 0) {
    local_a8 = in_stack_00000018._0_8_;
    __x = (value_type *)in_stack_00000000.y;
    this_01 = (SurfacePoint *)in_stack_00000000.z;
    auVar4._24_40_ = in_stack_fffffffffffffb88._24_40_;
    auVar4._0_16_ = in_stack_fffffffffffffb88._0_16_;
    auVar4._16_8_ = local_a8;
    local_b8 = __x;
    pSStack_b0 = this_01;
    SurfacePoint::SurfacePoint(this_01,(Face)auVar4._16_16_,in_stack_fffffffffffffb88._40_24_);
    ::std::
    vector<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
    ::push_back((vector<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
                 *)this_01,__x);
  }
  dVar6 = Vector3::norm2(this);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_108 = in_stack_00000018._0_8_;
    local_118 = in_stack_00000000.y;
    dStack_110 = in_stack_00000000.z;
    baryCoords.y = (double)in_stack_fffffffffffffbe8;
    baryCoords.x = (double)in_stack_fffffffffffffbe0;
    baryCoords.z = in_stack_fffffffffffffbf0;
    projectInsideTriangle(baryCoords);
    dVar6 = geometrycentral::sum(this);
    Vector3::constant(&local_130,dVar6 / 3.0);
    Vector3::operator-=(this,&local_130);
    face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffbf0;
    face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffbe8;
    anon_unknown_2::vertexCoordinatesInTriangle(in_stack_fffffffffffffbe0,face);
    baryVec.y = (double)in_stack_fffffffffffffbf8._0_8_;
    baryVec.z = (double)in_stack_fffffffffffffbf8._8_8_;
    baryVec.x = in_stack_fffffffffffffbf0;
    anon_unknown_2::barycentricDisplacementToCartesian(in_stack_fffffffffffffbd0,baryVec);
    dVar17 = in_stack_00000018._0_8_;
    dVar6 = in_stack_00000000.y;
    dVar16 = in_stack_00000000.z;
    dVar14 = in_stack_00000018._8_8_;
    dVar15 = in_stack_00000018._16_8_;
    pPVar19 = in_RDX;
    sVar20 = in_RCX;
    VVar8 = unit((Vector2 *)0x2faa3a);
    norm((Vector2 *)0x2faa7f);
    uVar11 = 1;
    uVar12 = 1;
    uVar13 = 1;
    uVar10 = 1;
    uVar9 = 0x101;
    face_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind
         = sVar20;
    face_00.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
    mesh = pPVar19;
    VVar7.y = in_RSI;
    VVar7.x = (double)in_R8;
    anon_unknown_2::traceInFaceBarycentric
              (in_stack_ffffffffffffffc8,face_00,in_stack_00000000,(Vector3)in_stack_00000018,VVar7,
               in_stack_ffffffffffffffc0,edgeIsHittable,in_stack_ffffffffffffffb8);
    auVar2._56_8_ = uStack_210;
    auVar2._0_56_ = in_stack_fffffffffffffdb8;
    auVar2 = vmovdqu64_avx512f(auVar2);
    auVar5._32_32_ = auStack_1e8;
    auVar5._0_32_ = local_208;
    auVar3 = vmovdqu64_avx512f(auVar5);
    auVar1._32_32_ = auStack_1c8;
    auVar1._0_32_ = auStack_1e8;
    auVar4 = vmovdqu64_avx512f(auVar1);
    auVar4 = vmovdqu64_avx512f(auVar4);
    uStack_2d8 = auVar4._32_8_;
    auVar3 = vmovdqu64_avx512f(auVar3);
    local_2f8 = auVar3._32_32_;
    auVar2 = vmovdqu64_avx512f(auVar2);
    auVar2 = vmovdqu64_avx512f(auVar2);
    auVar5 = vmovdqu64_avx512f(auVar3);
    auVar3._32_8_ = uStack_2d8;
    auVar3._0_32_ = local_2f8;
    auVar3._40_8_ = auVar4._40_8_;
    auVar3._48_8_ = auVar4._48_8_;
    auVar3._56_8_ = auVar4._56_8_;
    auVar3 = vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar5);
    vmovdqu64_avx512f(auVar2);
    prevTraceEnd_00._2_1_ = uVar10;
    prevTraceEnd_00._0_2_ = uVar9;
    prevTraceEnd_00._3_2_ = in_stack_fffffffffffffd53;
    prevTraceEnd_00._5_1_ = uVar11;
    prevTraceEnd_00._6_1_ = uVar12;
    prevTraceEnd_00._7_1_ = uVar13;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)VVar8.x;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)VVar8.y;
    prevTraceEnd_00.tCross = dVar14;
    prevTraceEnd_00.traceVectorInHalfedgeDir.x = dVar15;
    prevTraceEnd_00.traceVectorInHalfedgeDir.y = (double)in_stack_00000030;
    prevTraceEnd_00.traceVectorInHalfedgeLen = (double)in_stack_fffffffffffffd80;
    prevTraceEnd_00.endPoint._0_8_ = dVar6;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)dVar16;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)dVar17;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)in_stack_fffffffffffffda0;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_RDX;
    prevTraceEnd_00.endPoint.tEdge = (double)in_RCX;
    auVar18 = in_stack_fffffffffffffdb8._16_24_;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)SUB168(in_stack_fffffffffffffdb8._0_16_,0);
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         SUB168(in_stack_fffffffffffffdb8._0_16_,8);
    prevTraceEnd_00.endPoint.faceCoords.x = (double)auVar18._0_8_;
    prevTraceEnd_00.endPoint.faceCoords.y = (double)auVar18._8_8_;
    prevTraceEnd_00.endPoint.faceCoords.z = (double)auVar18._16_8_;
    prevTraceEnd_00.incomingDirToPoint.x = (double)SUB168(in_stack_fffffffffffffdb8._40_16_,0);
    prevTraceEnd_00.incomingDirToPoint.y = (double)SUB168(in_stack_fffffffffffffdb8._40_16_,8);
    anon_unknown_2::traceGeodesic_iterative
              (auVar4._56_8_,auVar4._48_8_,prevTraceEnd_00,auVar4._40_8_);
    IntrinsicGeometryInterface::unrequireVertexAngleSums((IntrinsicGeometryInterface *)0x2fabfd);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex
              ((IntrinsicGeometryInterface *)0x2fac0c);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace
              ((IntrinsicGeometryInterface *)0x2fac1b);
  }
  else {
    IntrinsicGeometryInterface::unrequireVertexAngleSums((IntrinsicGeometryInterface *)0x2fa73f);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex
              ((IntrinsicGeometryInterface *)0x2fa74e);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace
              ((IntrinsicGeometryInterface *)0x2fa75d);
    if ((in_R8[1] & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"zero vec passed to trace, do something good here");
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    VVar7 = Vector2::zero();
    in_RDI->endingDir = VVar7;
  }
  return in_RDI;
}

Assistant:

TraceGeodesicResult traceGeodesic(IntrinsicGeometryInterface& geom, Face startFace, Vector3 startBary,
                                  Vector3 traceBaryVec, const TraceOptions& traceOptions) {


  geom.requireVertexAngleSums();
  geom.requireHalfedgeVectorsInVertex();
  geom.requireHalfedgeVectorsInFace();

  // The output data
  TraceGeodesicResult result;
  result.hasPath = traceOptions.includePath;
  if (traceOptions.includePath) {
    result.pathPoints.push_back(SurfacePoint(startFace, startBary));
  }

  if (TRACE_PRINT) {
    cout << "\n>>> Trace query (barycentric) from " << startFace << " " << startBary << " vec = " << traceBaryVec
         << endl;
  }

  // Early-out if zero
  if (traceBaryVec.norm2() == 0) {
    geom.unrequireVertexAngleSums();
    geom.unrequireHalfedgeVectorsInVertex();
    geom.unrequireHalfedgeVectorsInFace();

    // probably want to ensure we still return a point in a face...
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("zero vec passed to trace, do something good here");
    }

    result.endingDir = Vector2::zero();
    return result;
  }

  // Make sure the input is sane
  startBary = projectInsideTriangle(startBary);
  traceBaryVec -= Vector3::constant(sum(traceBaryVec) / 3);

  // Construct the cartesian equivalent
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, startFace);
  Vector2 traceVectorCartesian = barycentricDisplacementToCartesian(vertexCoords, traceBaryVec);

  // Trace the first point starting inside the face
  TraceSubResult prevTraceEnd =
      traceInFaceBarycentric(geom, startFace, startBary, traceBaryVec, unit(traceVectorCartesian),
                             norm(traceVectorCartesian), {true, true, true}, traceOptions);

  // Keep tracing through triangles until finished
  traceGeodesic_iterative(geom, result, prevTraceEnd, traceOptions);

  geom.unrequireVertexAngleSums();
  geom.unrequireHalfedgeVectorsInVertex();
  geom.unrequireHalfedgeVectorsInFace();

  return result;
}